

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int target_get_expiry_policy(TARGET_HANDLE target,terminus_expiry_policy *expiry_policy_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  undefined8 in_RAX;
  AMQP_VALUE value;
  uint32_t item_count;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  if (target == (TARGET_HANDLE)0x0) {
    return 0x3685;
  }
  iVar1 = amqpvalue_get_composite_item_count(target->composite_value,&local_14);
  if (iVar1 != 0) {
    return 0x368d;
  }
  if (((2 < local_14) &&
      (value = amqpvalue_get_composite_item_in_place(target->composite_value,2),
      value != (AMQP_VALUE)0x0)) && (AVar2 = amqpvalue_get_type(value), AVar2 != AMQP_TYPE_NULL)) {
    iVar1 = amqpvalue_get_symbol(value,expiry_policy_value);
    if (iVar1 == 0) {
      return 0;
    }
    AVar2 = amqpvalue_get_type(value);
    if (AVar2 != AMQP_TYPE_NULL) {
      return 0x36a6;
    }
  }
  *expiry_policy_value = "session-end";
  return 0;
}

Assistant:

int target_get_expiry_policy(TARGET_HANDLE target, terminus_expiry_policy* expiry_policy_value)
{
    int result;

    if (target == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        if (amqpvalue_get_composite_item_count(target_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                *expiry_policy_value = terminus_expiry_policy_session_end;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(target_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *expiry_policy_value = terminus_expiry_policy_session_end;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_terminus_expiry_policy(item_value, expiry_policy_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *expiry_policy_value = terminus_expiry_policy_session_end;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}